

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

void __thiscall AActor::MarkPrecacheSounds(AActor *this)

{
  sfxinfo_t::MarkUsed(S_sfx.Array + (this->SeeSound).super_FSoundID.ID);
  sfxinfo_t::MarkUsed(S_sfx.Array + (this->AttackSound).super_FSoundID.ID);
  sfxinfo_t::MarkUsed(S_sfx.Array + (this->PainSound).super_FSoundID.ID);
  sfxinfo_t::MarkUsed(S_sfx.Array + (this->DeathSound).super_FSoundID.ID);
  sfxinfo_t::MarkUsed(S_sfx.Array + (this->ActiveSound).super_FSoundID.ID);
  sfxinfo_t::MarkUsed(S_sfx.Array + (this->UseSound).super_FSoundID.ID);
  sfxinfo_t::MarkUsed(S_sfx.Array + (this->BounceSound).super_FSoundID.ID);
  sfxinfo_t::MarkUsed(S_sfx.Array + (this->WallBounceSound).super_FSoundID.ID);
  sfxinfo_t::MarkUsed(S_sfx.Array + (this->CrushPainSound).super_FSoundID.ID);
  return;
}

Assistant:

void AActor::MarkPrecacheSounds() const
{
	SeeSound.MarkUsed();
	AttackSound.MarkUsed();
	PainSound.MarkUsed();
	DeathSound.MarkUsed();
	ActiveSound.MarkUsed();
	UseSound.MarkUsed();
	BounceSound.MarkUsed();
	WallBounceSound.MarkUsed();
	CrushPainSound.MarkUsed();
}